

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void timediffFunc(sqlite3_context *context,int NotUsed1,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  int M;
  int Y;
  char sign;
  sqlite3_str sRes;
  DateTime d2;
  DateTime d1;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined3 in_stack_ffffffffffffff5c;
  undefined4 uVar7;
  char cVar8;
  int argc;
  undefined4 in_stack_ffffffffffffff68;
  undefined1 local_88 [24];
  undefined1 *local_70;
  long local_68;
  int local_60;
  int local_5c;
  undefined1 local_40;
  long local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int in_stack_ffffffffffffffe0;
  StrAccum *in_stack_ffffffffffffffe8;
  
  argc = (int)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = CONCAT13(0xaa,in_stack_ffffffffffffff5c);
  uVar6 = 0xaaaaaaaa;
  uVar5 = 0xaaaaaaaa;
  memcpy(&local_38,&DAT_002af6a0,0x30);
  memcpy(&local_68,&DAT_002af6d0,0x30);
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = isDate((sqlite3_context *)CONCAT44(in_ESI,in_stack_ffffffffffffff68),argc,
                 (sqlite3_value **)CONCAT44(uVar7,uVar6),
                 (DateTime *)CONCAT44(uVar5,in_stack_ffffffffffffff50));
  if ((iVar2 == 0) &&
     (iVar2 = isDate((sqlite3_context *)CONCAT44(in_ESI,in_stack_ffffffffffffff68),argc,
                     (sqlite3_value **)CONCAT44(uVar7,uVar6),
                     (DateTime *)CONCAT44(uVar5,in_stack_ffffffffffffff50)), iVar2 == 0)) {
    computeYMD_HMS((DateTime *)0x22c448);
    computeYMD_HMS((DateTime *)0x22c452);
    if (local_38 < local_68) {
      uVar6 = 0x2d000000;
      uVar3 = local_60 - local_30;
      if (uVar3 != 0) {
        local_60 = local_30;
        local_40 = 0;
        computeJD((DateTime *)CONCAT44(uVar5,in_stack_ffffffffffffff50));
      }
      uVar4 = local_5c - local_2c;
      if ((int)uVar4 < 0) {
        uVar3 = uVar3 - 1;
        uVar4 = uVar4 + 0xc;
      }
      if (uVar4 != 0) {
        local_5c = local_2c;
        local_40 = 0;
        computeJD((DateTime *)CONCAT44(uVar4,in_stack_ffffffffffffff50));
      }
      while (cVar8 = (char)((uint)uVar6 >> 0x18), local_68 < local_38) {
        uVar4 = uVar4 - 1;
        if ((int)uVar4 < 0) {
          uVar4 = 0xb;
          uVar3 = uVar3 - 1;
        }
        local_5c = local_5c + 1;
        if (0xc < local_5c) {
          local_5c = 1;
          local_60 = local_60 + 1;
        }
        local_40 = 0;
        computeJD((DateTime *)CONCAT44(uVar4,in_stack_ffffffffffffff50));
      }
      local_38 = local_68 - local_38;
    }
    else {
      uVar6 = 0x2b000000;
      uVar3 = local_30 - local_60;
      if (uVar3 != 0) {
        local_60 = local_30;
        local_40 = 0;
        computeJD((DateTime *)CONCAT44(uVar5,in_stack_ffffffffffffff50));
      }
      uVar4 = local_2c - local_5c;
      if ((int)uVar4 < 0) {
        uVar3 = uVar3 - 1;
        uVar4 = uVar4 + 0xc;
      }
      if (uVar4 != 0) {
        local_5c = local_2c;
        local_40 = 0;
        computeJD((DateTime *)CONCAT44(uVar4,in_stack_ffffffffffffff50));
      }
      while (cVar8 = (char)((uint)uVar6 >> 0x18), local_38 < local_68) {
        uVar4 = uVar4 - 1;
        if ((int)uVar4 < 0) {
          uVar4 = 0xb;
          uVar3 = uVar3 - 1;
        }
        local_5c = local_5c + -1;
        if (local_5c < 1) {
          local_5c = 0xc;
          local_60 = local_60 + -1;
        }
        local_40 = 0;
        computeJD((DateTime *)CONCAT44(uVar4,in_stack_ffffffffffffff50));
      }
      local_38 = local_38 - local_68;
    }
    local_38 = local_38 + 0x873dcf4ec200;
    clearYMD_HMS_TZ((DateTime *)&local_38);
    computeYMD_HMS((DateTime *)0x22c6d3);
    sqlite3StrAccumInit((StrAccum *)local_88,(sqlite3 *)0x0,(char *)0x0,0,100);
    sqlite3_str_appendf(in_stack_ffffffffffffffe8,local_88,"%c%04d-%02d-%02d %02d:%02d:%06.3f",
                        (ulong)(uint)(int)cVar8,(ulong)uVar3,(ulong)uVar4,(ulong)(local_28 - 1));
    sqlite3ResultStrAccum
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffffe0),
               (StrAccum *)CONCAT44(in_stack_ffffffffffffff3c,local_24));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void timediffFunc(
  sqlite3_context *context,
  int NotUsed1,
  sqlite3_value **argv
){
  char sign;
  int Y, M;
  DateTime d1, d2;
  sqlite3_str sRes;
  UNUSED_PARAMETER(NotUsed1);
  if( isDate(context, 1, &argv[0], &d1) ) return;
  if( isDate(context, 1, &argv[1], &d2) ) return;
  computeYMD_HMS(&d1);
  computeYMD_HMS(&d2);
  if( d1.iJD>=d2.iJD ){
    sign = '+';
    Y = d1.Y - d2.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d1.M - d2.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD<d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M--;
      if( d2.M<1 ){
        d2.M = 12;
        d2.Y--;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD -= d2.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }else /* d1<d2 */{
    sign = '-';
    Y = d2.Y - d1.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d2.M - d1.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD>d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M++;
      if( d2.M>12 ){
        d2.M = 1;
        d2.Y++;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD = d2.iJD - d1.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }
  clearYMD_HMS_TZ(&d1);
  computeYMD_HMS(&d1);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, 100);
  sqlite3_str_appendf(&sRes, "%c%04d-%02d-%02d %02d:%02d:%06.3f",
       sign, Y, M, d1.D-1, d1.h, d1.m, d1.s);
  sqlite3ResultStrAccum(context, &sRes);
}